

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

char * __thiscall
duckdb::StrfTimeFormat::WritePadded3(StrfTimeFormat *this,char *target,uint32_t value)

{
  ulong uVar1;
  char cVar2;
  
  if (value < 100) {
    *target = '0';
    target[1] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)value * 2];
    cVar2 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(value * 2) + 1];
  }
  else {
    uVar1 = (ulong)value % 100;
    cVar2 = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar1 * 2 + 1];
    target[1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar1 * 2];
    *target = (char)((ulong)value / 100) + '0';
  }
  target[2] = cVar2;
  return target + 3;
}

Assistant:

char *StrfTimeFormat::WritePadded3(char *target, uint32_t value) const {
	D_ASSERT(value < 1000);
	if (value >= 100) {
		WritePadded2(target + 1, value % 100);
		*target = char(uint8_t('0') + value / 100);
		return target + 3;
	} else {
		*target = '0';
		target++;
		return WritePadded2(target, value);
	}
}